

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_13::Poppifier::patchScope(Poppifier *this,Expression **expr)

{
  pointer pSVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  Expression *pEVar4;
  Block *pBVar5;
  type scope;
  
  pSVar1 = (this->scopeStack).
           super__Vector_base<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppEVar2 = pSVar1[-1].instrs.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar3 = pSVar1[-1].instrs.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  scope.instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       pSVar1[-1].instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pSVar1[-1].instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pSVar1[-1].instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar1[-1].instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar1 = (this->scopeStack).
           super__Vector_base<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->scopeStack).
  super__Vector_base<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar1 + -1;
  scope._0_8_ = ppEVar2;
  scope.instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppEVar3;
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&pSVar1[-1].instrs.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>);
  pEVar4 = *expr;
  if (pEVar4->_id == BlockId) {
    if ((ppEVar3 == ppEVar2) || (*ppEVar2 != pEVar4)) {
      ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
      set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar4 + 2),
                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&scope);
    }
  }
  else {
    pBVar5 = Builder::
             makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                       (&this->builder,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&scope,
                        (Type)(pEVar4->type).id);
    *expr = (Expression *)pBVar5;
  }
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&scope);
  return;
}

Assistant:

void Poppifier::patchScope(Expression*& expr) {
  auto scope = std::move(scopeStack.back());
  auto& instrs = scope.instrs;
  scopeStack.pop_back();
  if (auto* block = expr->dynCast<Block>()) {
    // Reuse blocks, but do not patch a block into itself, which would otherwise
    // happen when emitting if/else or try/catch arms and function bodies.
    if (instrs.size() == 0 || instrs[0] != block) {
      block->list.set(instrs);
    }
  } else {
    // Otherwise create a new block, even if we have just a single
    // expression. We want blocks in every new scope rather than other
    // instructions because Poppy IR optimizations only look at the children of
    // blocks.
    expr = builder.makeBlock(instrs, expr->type);
  }
}